

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

bool bcache_remove_file(filemgr *file)

{
  bool bVar1;
  __pointer_type fname;
  hash_elem *in_RDI;
  fnamedic_item *fname_item;
  bool rv;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar2 = 0;
  _garbage_collect_zombie_fnames();
  fname = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x1228b4);
  if (fname != (__pointer_type)0x0) {
    pthread_spin_lock(&bcache_lock);
    bVar1 = _file_empty(fname);
    if (bVar1) {
      hash_remove((hash *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
      pthread_spin_unlock(&bcache_lock);
      bVar1 = _fname_try_free((fnamedic_item *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
      if (bVar1) {
        _fname_free(fname);
        bVar2 = 1;
      }
    }
    else {
      pthread_spin_unlock(&bcache_lock);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool bcache_remove_file(struct filemgr *file)
{
    bool rv = false;
    struct fnamedic_item *fname_item;

    // Before proceeding with deletion, garbage collect zombie files
    _garbage_collect_zombie_fnames();
    fname_item = file->bcache;

    if (fname_item) {
        // acquire lock
        spin_lock(&bcache_lock);
        // file must be empty
        if (!_file_empty(fname_item)) {
            spin_unlock(&bcache_lock);
            DBG("Warning: failed to remove fnamedic_item instance for a file '%s' "
                "because the fnamedic_item instance is not empty!\n",
                file->filename);
            return rv;
        }

        // remove from fname dictionary hash table
        hash_remove(&fnamedic, &fname_item->hash_elem);
        spin_unlock(&bcache_lock);

        // We don't need to grab the file buffer cache's partition locks
        // at once because this function is only invoked when there are
        // no database handles that access the file.
        if (_fname_try_free(fname_item)) {
            _fname_free(fname_item); // no other callers accessing this file
            rv = true;
        } // else fnamedic_item is in use by _bcache_evict. Deletion delayed
    }
    return rv;
}